

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exorList.c
# Opt level: O0

void DelocateQueques(void)

{
  int local_c;
  int i;
  
  for (local_c = 0; local_c < 3; local_c = local_c + 1) {
    if (s_Que[local_c].pC1 != (Cube **)0x0) {
      free(s_Que[local_c].pC1);
      s_Que[local_c].pC1 = (Cube **)0x0;
    }
    if (s_Que[local_c].pC2 != (Cube **)0x0) {
      free(s_Que[local_c].pC2);
      s_Que[local_c].pC2 = (Cube **)0x0;
    }
    if (s_Que[local_c].ID1 != (byte *)0x0) {
      free(s_Que[local_c].ID1);
      s_Que[local_c].ID1 = (byte *)0x0;
    }
    if (s_Que[local_c].ID2 != (byte *)0x0) {
      free(s_Que[local_c].ID2);
      s_Que[local_c].ID2 = (byte *)0x0;
    }
  }
  return;
}

Assistant:

void DelocateQueques()
{
    int i;
    for ( i = 0; i < 3; i++ )
    {
        ABC_FREE( s_Que[i].pC1 );
        ABC_FREE( s_Que[i].pC2 );
        ABC_FREE( s_Que[i].ID1 );
        ABC_FREE( s_Que[i].ID2 );
    }
}